

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerReflection::emit_types(CompilerReflection *this)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRType *type;
  SPIRType *pSVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  bool emitted_open_tag;
  SmallVector<unsigned_int,_8UL> physical_pointee_types;
  bool local_7d;
  uint32_t local_7c;
  LoopLock local_78;
  ParsedIR *local_70;
  SmallVector<unsigned_int,_8UL> local_68;
  
  local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  local_7d = false;
  local_68.buffer_capacity = 8;
  local_70 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_70);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar7 = 0; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar7);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeType) {
      type = ParsedIR::get<spirv_cross::SPIRType>(local_70,id);
      if (((type->basetype == Struct) && (type->pointer == false)) &&
         ((type->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
        emit_type(this,id,&local_7d);
      }
      else {
        bVar3 = type_is_reference(this,type);
        if (bVar3) {
          pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
          if (((pSVar4->basetype != Struct) || (pSVar4->pointer != false)) ||
             ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
            puVar5 = ::std::
                     __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)1>const>>
                               (local_68.super_VectorView<unsigned_int>.ptr,
                                (char *)local_68.super_VectorView<unsigned_int>.ptr +
                                local_68.super_VectorView<unsigned_int>.buffer_size * 4,
                                &type->parent_type);
            if (puVar5 == (uint *)((char *)local_68.super_VectorView<unsigned_int>.ptr +
                                  local_68.super_VectorView<unsigned_int>.buffer_size * 4)) {
              local_7c = (type->parent_type).id;
              SmallVector<unsigned_int,_8UL>::push_back(&local_68,&local_7c);
            }
          }
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_78);
  puVar5 = local_68.super_VectorView<unsigned_int>.ptr;
  lVar7 = local_68.super_VectorView<unsigned_int>.buffer_size << 2;
  for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 4) {
    emit_type(this,*(uint32_t *)((char *)puVar5 + lVar6),&local_7d);
  }
  if (local_7d != false) {
    simple_json::Stream::end_json_object
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector(&local_68);
  return;
}

Assistant:

void CompilerReflection::emit_types()
{
	bool emitted_open_tag = false;

	SmallVector<uint32_t> physical_pointee_types;

	// If we have physical pointers or arrays of physical pointers, it's also helpful to emit the pointee type
	// and chain the type hierarchy. For POD, arrays can emit the entire type in-place.
	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
		if (naturally_emit_type(type))
		{
			emit_type(self, emitted_open_tag);
		}
		else if (type_is_reference(type))
		{
			if (!naturally_emit_type(this->get<SPIRType>(type.parent_type)) &&
			    find(physical_pointee_types.begin(), physical_pointee_types.end(), type.parent_type) ==
			        physical_pointee_types.end())
			{
				physical_pointee_types.push_back(type.parent_type);
			}
		}
	});

	for (uint32_t pointee_type : physical_pointee_types)
		emit_type(pointee_type, emitted_open_tag);

	if (emitted_open_tag)
	{
		json_stream->end_json_object();
	}
}